

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O3

Node __thiscall verona::local_fq(verona *this,Node *node)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Token *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  Node NVar5;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  _Rb_tree_node_base local_88;
  size_t local_68;
  undefined1 local_60;
  element_type *local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_a0._0_8_ = Class;
  local_a0._8_8_ = TypeAlias;
  local_90 = (undefined1  [8])TypeParam;
  local_88._0_8_ = Trait;
  local_88._M_parent = (_Base_ptr)Function;
  pTVar2 = ::std::
           __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                     ((element_type *)local_a0,&local_88._M_left,
                      &((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->type_);
  peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (pTVar2 == (Token *)&local_88._M_left) {
    local_a0._0_8_ = Class;
    local_a0._8_8_ = TypeAlias;
    local_90 = (undefined1  [8])TypeParam;
    local_88._0_8_ = Trait;
    local_88._M_parent = (_Base_ptr)Function;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
    local_40 = (element_type *)local_a0;
    trieste::NodeDef::parent
              ((NodeDef *)&stack0xffffffffffffffa8,(initializer_list<trieste::Token> *)peVar4);
    _Var1._M_pi = _Stack_50._M_pi;
    peVar4 = local_58;
    local_58 = (element_type *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
    (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         _Var1._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
      }
    }
    peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  local_a0._8_8_ =
       (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  local_a0._0_8_ = peVar4;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88._M_left = &local_88;
    local_a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
    local_88._M_parent = (_Base_ptr)0x0;
    local_68 = 0;
    local_60 = 0;
    local_88._M_right = local_88._M_left;
    goto LAB_00156f81;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_00156f58;
    LOCK();
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
LAB_00156f58:
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
  }
  local_88._M_left = &local_88;
  local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
  local_88._M_parent = (_Base_ptr)0x0;
  local_68 = 0;
  local_60 = 0;
  local_88._M_right = local_88._M_left;
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
LAB_00156f81:
  make_fq((Lookup *)this,SUB81(local_a0,0));
  ::std::
  _Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<trieste::NodeDef>,_std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>,_std::_Select1st<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>,_std::owner_less<void>,_std::allocator<std::pair<const_std::shared_ptr<trieste::NodeDef>,_std::shared_ptr<trieste::NodeDef>_>_>_>
               *)local_90);
  _Var3._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    _Var3._M_pi = extraout_RDX_00;
  }
  NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar5.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node local_fq(Node node)
  {
    // Build an FQType for the local type.
    if (!node->in({Class, TypeAlias, TypeParam, Trait, Function}))
      node = node->parent({Class, TypeAlias, TypeParam, Trait, Function});

    Lookup l(node);
    return make_fq(l, true);
  }